

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraphBuilder.cpp
# Opt level: O3

vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_> *
AssemblyCode::buildControlFlowGraph
          (vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
           *__return_storage_ptr__,AssemblyCommands *commands)

{
  pointer *pppCVar1;
  ulong uVar2;
  int iVar3;
  element_type *peVar4;
  pointer pCVar5;
  iterator iVar6;
  long lVar7;
  AbstractJumpCommand *this;
  mapped_type *pmVar8;
  pointer pCVar9;
  long lVar10;
  pointer psVar11;
  ulong uVar12;
  pointer psVar13;
  ulong uVar14;
  CodeLine *labelJumpLine;
  CodeLine codeLine;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labelToIndexMap;
  CodeLine *local_128;
  CodeLine *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [24];
  pointer local_f0;
  pointer ppCStack_e8;
  pointer local_e0;
  pointer ppCStack_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  bool local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  buildLabelMap_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&local_60,commands);
  (__return_storage_ptr__->
  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar11 = (commands->
            super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar13 = (commands->
            super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar13 != psVar11) {
    lVar10 = 8;
    uVar12 = 0;
    do {
      local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e0 = (pointer)0x0;
      ppCStack_d8 = (pointer)0x0;
      local_f0 = (pointer)0x0;
      ppCStack_e8 = (pointer)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_d0._M_impl.super__Rb_tree_header._M_header;
      local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a0._M_impl.super__Rb_tree_header._M_header;
      local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_108._0_4_ = (undefined4)uVar12;
      local_118._0_8_ = *(undefined8 *)((long)psVar11 + lVar10 + -8);
      local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar11->
                         super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar10));
      lVar7 = *(long *)((long)(commands->
                              super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar10 + -8);
      if (lVar7 == 0) {
        local_70 = false;
      }
      else {
        lVar7 = __dynamic_cast(lVar7,&AssemblyCommand::typeinfo,&MoveRegRegCommand::typeinfo,0);
        local_70 = lVar7 != 0;
      }
      std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::push_back
                (__return_storage_ptr__,(value_type *)local_118);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_a0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_d0);
      if (ppCStack_e8 != (pointer)0x0) {
        operator_delete(ppCStack_e8);
      }
      if ((pointer)local_108._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_108._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
      uVar12 = uVar12 + 1;
      psVar11 = (commands->
                super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar13 = (commands->
                super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      lVar10 = lVar10 + 0x10;
    } while (uVar12 < (ulong)((long)psVar13 - (long)psVar11 >> 4));
  }
  if ((long)psVar13 - (long)psVar11 != 0) {
    uVar14 = (long)psVar13 - (long)psVar11 >> 4;
    uVar12 = 0;
    do {
      peVar4 = psVar11[uVar12].
               super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar4 == (element_type *)0x0) ||
         (this = (AbstractJumpCommand *)
                 __dynamic_cast(peVar4,&AssemblyCommand::typeinfo,&AbstractJumpCommand::typeinfo,0),
         this == (AbstractJumpCommand *)0x0)) {
        uVar2 = uVar12 + 1;
        if (uVar14 != uVar2) {
          pCVar5 = (__return_storage_ptr__->
                   super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_118._0_8_ = pCVar5 + uVar2;
          iVar6._M_current =
               *(pointer *)
                ((long)&pCVar5[uVar12].nextLines.
                        super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                        ._M_impl + 8);
          if (iVar6._M_current ==
              *(pointer *)
               ((long)&pCVar5[uVar12].nextLines.
                       super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                       ._M_impl + 0x10)) {
            std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
            _M_realloc_insert<AssemblyCode::CodeLine*>
                      ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                       &pCVar5[uVar12].nextLines,iVar6,(CodeLine **)local_118);
          }
          else {
            *iVar6._M_current = (CodeLine *)local_118._0_8_;
            pppCVar1 = (pointer *)
                       ((long)&pCVar5[uVar12].nextLines.
                               super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                               ._M_impl + 8);
            *pppCVar1 = *pppCVar1 + 1;
          }
          pCVar5 = (__return_storage_ptr__->
                   super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_118._0_8_ = pCVar5 + uVar12;
          iVar6._M_current =
               *(pointer *)
                ((long)&pCVar5[uVar2].prevLines.
                        super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                        ._M_impl + 8);
          if (iVar6._M_current ==
              *(pointer *)
               ((long)&pCVar5[uVar2].prevLines.
                       super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                       ._M_impl + 0x10)) {
            std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
            _M_realloc_insert<AssemblyCode::CodeLine*>
                      ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                       &pCVar5[uVar2].prevLines,iVar6,(CodeLine **)local_118);
          }
          else {
            *iVar6._M_current = (CodeLine *)local_118._0_8_;
            pppCVar1 = (pointer *)
                       ((long)&pCVar5[uVar2].prevLines.
                               super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                               ._M_impl + 8);
            *pppCVar1 = *pppCVar1 + 1;
          }
        }
      }
      else {
        AbstractJumpCommand::getLabel_abi_cxx11_((string *)local_118,this);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)&local_60,(string *)local_118);
        iVar3 = *pmVar8;
        pCVar5 = (__return_storage_ptr__->
                 super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pCVar9 = pCVar5;
        if ((CodeLine *)local_118._0_8_ != (CodeLine *)local_108) {
          operator_delete((void *)local_118._0_8_);
          pCVar9 = (__return_storage_ptr__->
                   super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        local_128 = pCVar5 + iVar3;
        iVar6._M_current =
             *(pointer *)
              ((long)&pCVar9[uVar12].nextLines.
                      super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                      ._M_impl + 8);
        if (iVar6._M_current ==
            *(pointer *)
             ((long)&pCVar9[uVar12].nextLines.
                     super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                     ._M_impl + 0x10)) {
          std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
          _M_realloc_insert<AssemblyCode::CodeLine*const&>
                    ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                     &pCVar9[uVar12].nextLines,iVar6,&local_128);
        }
        else {
          *iVar6._M_current = local_128;
          pppCVar1 = (pointer *)
                     ((long)&pCVar9[uVar12].nextLines.
                             super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                             ._M_impl + 8);
          *pppCVar1 = *pppCVar1 + 1;
        }
        local_118._0_8_ =
             (__return_storage_ptr__->
             super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>).
             _M_impl.super__Vector_impl_data._M_start + uVar12;
        iVar6._M_current =
             (local_128->prevLines).
             super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (local_128->prevLines).
            super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
          _M_realloc_insert<AssemblyCode::CodeLine*>
                    ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                     &local_128->prevLines,iVar6,(CodeLine **)local_118);
        }
        else {
          *iVar6._M_current = (CodeLine *)local_118._0_8_;
          pppCVar1 = &(local_128->prevLines).
                      super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
        lVar10 = __dynamic_cast(this,&AbstractJumpCommand::typeinfo,&JumpCommand::typeinfo,0);
        if ((lVar10 == 0) &&
           ((long)(commands->
                  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(commands->
                  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4 != uVar12 + 1)) {
          pCVar5 = (__return_storage_ptr__->
                   super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_118._0_8_ = pCVar5 + uVar12 + 1;
          iVar6._M_current =
               *(pointer *)
                ((long)&pCVar5[uVar12].nextLines.
                        super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                        ._M_impl + 8);
          if (iVar6._M_current ==
              *(pointer *)
               ((long)&pCVar5[uVar12].nextLines.
                       super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                       ._M_impl + 0x10)) {
            std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
            _M_realloc_insert<AssemblyCode::CodeLine*const&>
                      ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                       &pCVar5[uVar12].nextLines,iVar6,(CodeLine **)local_118);
          }
          else {
            *iVar6._M_current = (CodeLine *)local_118._0_8_;
            pppCVar1 = (pointer *)
                       ((long)&pCVar5[uVar12].nextLines.
                               super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                               ._M_impl + 8);
            *pppCVar1 = *pppCVar1 + 1;
          }
          local_120 = (__return_storage_ptr__->
                      super__Vector_base<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar12;
          iVar6._M_current = *(pointer *)(local_118._0_8_ + 0x38);
          if (iVar6._M_current == *(pointer *)(local_118._0_8_ + 0x40)) {
            std::vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>>::
            _M_realloc_insert<AssemblyCode::CodeLine*>
                      ((vector<AssemblyCode::CodeLine*,std::allocator<AssemblyCode::CodeLine*>> *)
                       (local_118._0_8_ + 0x30),iVar6,&local_120);
          }
          else {
            *iVar6._M_current = local_120;
            *(pointer *)(local_118._0_8_ + 0x38) = *(pointer *)(local_118._0_8_ + 0x38) + 1;
          }
        }
      }
      uVar12 = uVar12 + 1;
      psVar11 = (commands->
                super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (long)(commands->
                     super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar11 >> 4;
    } while (uVar12 < uVar14);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AssemblyCode::CodeLine> AssemblyCode::buildControlFlowGraph(const AssemblyCommands &commands) {
    std::map<std::string, int> labelToIndexMap = buildLabelMap(commands);
    std::vector<AssemblyCode::CodeLine> lines;

    // fill lines
    for (int i = 0; i < commands.size(); ++i) {
        CodeLine codeLine;
        codeLine.lineNumber = i;
        codeLine.command = commands[i];

        AssemblyCode::MoveRegRegCommand* moveRegRegCommand =
                dynamic_cast<AssemblyCode::MoveRegRegCommand*>(commands[i].get());

        codeLine.isMoveRegReg = moveRegRegCommand != nullptr;

        lines.push_back(codeLine);
    }

    // build graph
    for (int i = 0; i < commands.size(); ++i) {
        const AbstractJumpCommand* abstractJumpCommand = dynamic_cast<const AbstractJumpCommand*>(commands[i].get());
        if (abstractJumpCommand != nullptr) {
            CodeLine* labelJumpLine = &lines[labelToIndexMap[abstractJumpCommand->getLabel()]];

            lines[i].nextLines.push_back(labelJumpLine);
            labelJumpLine->prevLines.push_back(&lines[i]);

            const JumpCommand* jumpCommand = dynamic_cast<const JumpCommand*>(abstractJumpCommand);
            if (jumpCommand == nullptr && (i + 1) != commands.size()) {
                // conditional jump
                CodeLine* nextLine = &lines[i + 1];
                lines[i].nextLines.push_back(nextLine);
                nextLine->prevLines.push_back(&lines[i]);
            }
        } else {
            if ((i + 1) != commands.size()) {
                lines[i].nextLines.push_back(&lines[i + 1]);
                lines[i + 1].prevLines.push_back(&lines[i]);
            }
        }
    }

    return lines;
}